

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ukf.cpp
# Opt level: O3

void __thiscall UKF::SetInitialValues(UKF *this,MeasurementPackage *meas_package)

{
  double dVar1;
  Matrix<double,__1,__1,_0,__1,__1> *__ptr;
  ulong uVar2;
  double *pdVar3;
  DenseIndex DVar4;
  DenseIndex DVar5;
  CommaInitializer<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *pCVar6;
  long lVar7;
  CommaInitializer<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *pCVar8;
  char *__function;
  float fVar9;
  float fVar10;
  CommaInitializer<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> local_118;
  float local_f0;
  float local_ec;
  Scalar local_e8;
  Scalar local_e0;
  Scalar local_d8;
  double local_d0;
  Scalar local_c8;
  Scalar local_c0;
  Scalar local_b8;
  Scalar local_b0;
  Scalar local_a8;
  Scalar local_a0;
  Scalar local_98;
  Scalar local_90;
  Scalar local_88;
  Scalar local_80;
  Scalar local_78;
  Scalar local_70;
  Scalar local_68;
  Scalar local_60;
  Scalar local_58;
  Scalar local_50;
  Scalar local_48;
  Scalar local_40;
  Scalar local_38;
  Scalar local_30;
  Scalar local_28;
  
  local_118.m_xpr = (Matrix<double,__1,__1,_0,__1,__1> *)0x0;
  local_118.m_row = 0;
  local_118.m_col = 0;
  Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::resize
            ((DenseStorage<double,__1,__1,__1,_0> *)&local_118,0x19,5,5);
  __ptr = (Matrix<double,__1,__1,_0,__1,__1> *)
          (this->P_).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
          m_data;
  (this->P_).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data =
       (double *)local_118.m_xpr;
  DVar4 = (this->P_).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
          m_rows;
  DVar5 = (this->P_).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
          m_cols;
  (this->P_).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_rows =
       local_118.m_row;
  (this->P_).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_cols =
       local_118.m_col;
  local_118.m_xpr = __ptr;
  local_118.m_row = DVar4;
  local_118.m_col = DVar5;
  free(__ptr);
  local_118.m_row = 0;
  local_118.m_col = 1;
  local_118.m_currentBlockRows = 1;
  *(this->P_).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data =
       1.0;
  local_d8 = 0.0;
  local_118.m_xpr = &this->P_;
  pCVar6 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (&local_118,&local_d8);
  local_e0 = 0.0;
  pCVar6 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar6,&local_e0);
  local_e8 = 0.0;
  pCVar6 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar6,&local_e8);
  local_c8 = 0.0;
  pCVar6 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar6,&local_c8);
  local_28 = 0.0;
  pCVar6 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar6,&local_28);
  local_30 = 1.0;
  pCVar6 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar6,&local_30);
  local_38 = 0.0;
  pCVar6 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar6,&local_38);
  local_40 = 0.0;
  pCVar6 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar6,&local_40);
  local_48 = 0.0;
  pCVar6 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar6,&local_48);
  local_50 = 0.0;
  pCVar6 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar6,&local_50);
  local_58 = 0.0;
  pCVar6 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar6,&local_58);
  local_60 = 1.0;
  pCVar6 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar6,&local_60);
  local_68 = 0.0;
  pCVar6 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar6,&local_68);
  local_70 = 0.0;
  pCVar6 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar6,&local_70);
  local_78 = 0.0;
  pCVar6 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar6,&local_78);
  local_80 = 0.0;
  pCVar6 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar6,&local_80);
  local_88 = 0.0;
  pCVar6 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar6,&local_88);
  local_90 = 1.0;
  pCVar6 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar6,&local_90);
  local_98 = 0.0;
  pCVar6 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar6,&local_98);
  local_a0 = 0.0;
  pCVar6 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar6,&local_a0);
  local_a8 = 0.0;
  pCVar6 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar6,&local_a8);
  local_b0 = 0.0;
  pCVar6 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar6,&local_b0);
  local_b8 = 0.0;
  pCVar6 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar6,&local_b8);
  local_c0 = 1.0;
  Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_(pCVar6,&local_c0);
  lVar7 = ((local_118.m_xpr)->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).
          m_storage.m_cols;
  if (local_118.m_currentBlockRows + local_118.m_row ==
      ((local_118.m_xpr)->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).
      m_storage.m_rows) {
LAB_001045e1:
    if (local_118.m_col == lVar7) {
      if (meas_package->sensor_type_ == LASER) {
        lVar7 = (meas_package->raw_measurements_).
                super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows;
        if (lVar7 < 1) {
LAB_00104807:
          __assert_fail("index >= 0 && index < size()",
                        "/workspace/llm4binary/github/license_c_cmakelists/ksakmann[P]Unscented-Kalman-Filter/src/Eigen/src/Core/DenseCoeffsBase.h"
                        ,0xad,
                        "CoeffReturnType Eigen::DenseCoeffsBase<Eigen::Matrix<double, -1, 1>, 0>::operator()(Index) const [Derived = Eigen::Matrix<double, -1, 1>, Level = 0]"
                       );
        }
        local_118.m_xpr = (Matrix<double,__1,__1,_0,__1,__1> *)&this->x_;
        pdVar3 = (meas_package->raw_measurements_).
                 super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data;
        local_118.m_row = 0;
        local_118.m_col = 1;
        local_118.m_currentBlockRows = 1;
        *(this->x_).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data
             = *pdVar3;
        if (lVar7 == 1) goto LAB_00104807;
        pCVar8 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::operator_
                           ((CommaInitializer<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&local_118,
                            pdVar3 + 1);
        local_d8 = 0.0;
        pCVar8 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::operator_
                           (pCVar8,&local_d8);
        local_e0 = 0.0;
        pCVar8 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::operator_
                           (pCVar8,&local_e0);
        local_e8 = 0.0;
        Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::operator_
                  (pCVar8,&local_e8);
      }
      else {
        if (meas_package->sensor_type_ != RADAR) {
          return;
        }
        uVar2 = (meas_package->raw_measurements_).
                super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows;
        if ((((long)uVar2 < 1) || (uVar2 == 1)) || (uVar2 < 3)) goto LAB_00104807;
        pdVar3 = (meas_package->raw_measurements_).
                 super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data;
        dVar1 = *pdVar3;
        fVar10 = (float)pdVar3[1];
        local_d0 = pdVar3[2];
        local_ec = cosf(fVar10);
        local_ec = local_ec * (float)dVar1;
        fVar9 = sinf(fVar10);
        local_f0 = cosf(fVar10);
        fVar10 = sinf(fVar10);
        local_118.m_xpr = (Matrix<double,__1,__1,_0,__1,__1> *)&this->x_;
        local_118.m_row = 0;
        local_118.m_col = 1;
        local_118.m_currentBlockRows = 1;
        *(this->x_).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data
             = (double)local_ec;
        local_d8 = (Scalar)(fVar9 * (float)dVar1);
        pCVar8 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::operator_
                           ((CommaInitializer<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&local_118,
                            &local_d8);
        fVar10 = fVar10 * (float)local_d0;
        fVar9 = local_f0 * (float)local_d0;
        local_e0 = (Scalar)SQRT(fVar9 * fVar9 + fVar10 * fVar10);
        pCVar8 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::operator_
                           (pCVar8,&local_e0);
        local_e8 = 0.0;
        pCVar8 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::operator_
                           (pCVar8,&local_e8);
        local_c8 = 0.0;
        Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::operator_
                  (pCVar8,&local_c8);
      }
      if ((local_118.m_currentBlockRows + local_118.m_row ==
           ((local_118.m_xpr)->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).
           m_storage.m_rows) && (local_118.m_col == 1)) {
        return;
      }
      __function = 
      "XprType &Eigen::CommaInitializer<Eigen::Matrix<double, -1, 1>>::finished() [MatrixType = Eigen::Matrix<double, -1, 1>]"
      ;
      goto LAB_00104852;
    }
  }
  else if (lVar7 == 0) {
    lVar7 = 0;
    goto LAB_001045e1;
  }
  __function = 
  "XprType &Eigen::CommaInitializer<Eigen::Matrix<double, -1, -1>>::finished() [MatrixType = Eigen::Matrix<double, -1, -1>]"
  ;
LAB_00104852:
  __assert_fail("((m_row+m_currentBlockRows) == m_xpr.rows() || m_xpr.cols() == 0) && m_col == m_xpr.cols() && \"Too few coefficients passed to comma initializer (operator<<)\""
                ,
                "/workspace/llm4binary/github/license_c_cmakelists/ksakmann[P]Unscented-Kalman-Filter/src/Eigen/src/Core/CommaInitializer.h"
                ,0x6f,__function);
}

Assistant:

void UKF::SetInitialValues(const MeasurementPackage meas_package) {

  // initialize state covariance matrix P 
  P_ = MatrixXd(5, 5);
  P_ <<   1, 0,  0,  0,  0,
          0,  1, 0,  0,  0,
          0,  0,  1, 0,  0,
          0,  0,  0,  1, 0,
          0,  0,  0,  0,  1;

  if (meas_package.sensor_type_ == MeasurementPackage::RADAR) {
    
    // Convert radar from polar to cartesian coordinates and initialize state.
    float rho = meas_package.raw_measurements_(0);
    float phi = meas_package.raw_measurements_(1);
    float rhodot = meas_package.raw_measurements_(2);

    float px = rho * cos(phi);
    float py = rho * sin(phi);
    float vx = rhodot * cos(phi);
    float vy = rhodot * sin(phi);

    x_ << px,py,sqrt(vx*vx +vy*vy),0,0;

  } 

  else if (meas_package.sensor_type_ == MeasurementPackage::LASER) {

    // Initialize state.
    x_ << meas_package.raw_measurements_(0),meas_package.raw_measurements_(1),0,0,0;

  }

  return;

}